

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O1

int mk_iov_set_entry(mk_iov *mk_io,void *buf,int len,int free,int idx)

{
  int iVar1;
  iovec *piVar2;
  
  piVar2 = mk_io->io;
  piVar2[idx].iov_base = buf;
  piVar2[idx].iov_len = (long)len;
  mk_io->total_len = mk_io->total_len + (long)len;
  if (free == 1) {
    iVar1 = mk_io->buf_idx;
    mk_io->buf_to_free[iVar1] = buf;
    mk_io->buf_idx = iVar1 + 1;
  }
  return 0;
}

Assistant:

int mk_iov_set_entry(struct mk_iov *mk_io, void *buf, int len,
                     int free, int idx)
{
    mk_io->io[idx].iov_base = buf;
    mk_io->io[idx].iov_len = len;
    mk_io->total_len += len;

    if (free == MK_TRUE) {
        _mk_iov_set_free(mk_io, buf);
    }

    return 0;
}